

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::configureTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects
            (&this->super_TextureCubeMapArrayTextureSizeRTBase);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6d0))
            (1,&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Error generating frame buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x516);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTFragmentShader::configureTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects();

	/* Generate frame buffer object */
	gl.genFramebuffers(1, &m_draw_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating frame buffer object!");
}